

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screena.cpp
# Opt level: O2

void robot_stat(int n)

{
  int iVar1;
  int iVar2;
  
  if (robots[n].last_damage != robots[n].damage) {
    robots[n].last_damage = robots[n].damage;
    iVar1 = 0;
    if (col_1 != '\0') {
      iVar1 = 0x42;
    }
    move(n * 5 + 2,iVar1);
    printf("%03d",(ulong)(uint)robots[n].last_damage);
  }
  iVar1 = 0x4b;
  if (robots[n].last_scan != robots[n].scan) {
    robots[n].last_scan = robots[n].scan;
    iVar2 = 0;
    if (col_2 != '\0') {
      iVar2 = iVar1;
    }
    move(n * 5 + 2,iVar2);
    printf("%03d",(ulong)(uint)robots[n].last_scan);
  }
  if (robots[n].last_speed != robots[n].speed) {
    robots[n].last_speed = robots[n].speed;
    iVar2 = 0x42;
    if (col_1 == '\0') {
      iVar2 = 0;
    }
    move(n * 5 + 3,iVar2);
    printf("%03d",(ulong)(uint)robots[n].speed);
  }
  if (robots[n].last_heading == robots[n].heading) {
    return;
  }
  robots[n].last_heading = robots[n].heading;
  if (col_2 == '\0') {
    iVar1 = 0;
  }
  move(n * 5 + 3,iVar1);
  printf("%03d",(ulong)(uint)robots[n].heading);
  return;
}

Assistant:

void robot_stat(int n)
{
  int changed = 0;

  if (robots[n].last_damage != robots[n].damage) {
    robots[n].last_damage = robots[n].damage;
    move(5*n+2,col_1);
    printw("%03d",robots[n].last_damage);
    changed = 1;
  }
  if (robots[n].last_scan != robots[n].scan) {
    robots[n].last_scan = robots[n].scan;
    move(5*n+2,col_2);
    printw("%03d",robots[n].last_scan);
    changed = 1;
  }
  if (robots[n].last_speed != robots[n].speed) {
    robots[n].last_speed = robots[n].speed;
    move(5*n+3,col_1);
    printw("%03d",robots[n].speed);
    changed = 1;
  }
  if (robots[n].last_heading != robots[n].heading) {
    robots[n].last_heading = robots[n].heading;
    move(5*n+3,col_2);
    printw("%03d",robots[n].heading);
    changed = 1;
  }

/*
  move(5*n+4,col_1);
  printw("%3d",robots[n].x / CLICK);
  move(5*n+4,col_2);
  printw("%3d",robots[n].y / CLICK);
*/

  if (changed)
    refresh();
}